

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

LabelInstr * __thiscall IR::LabelInstr::CloneLabel(LabelInstr *this,BOOL fCreate)

{
  ImplicitCallFlags flags;
  OpCode opcode;
  uint uVar1;
  Func *this_00;
  code *pcVar2;
  bool bVar3;
  Cloner *pCVar4;
  undefined4 *puVar5;
  HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator> *pHVar6;
  LabelInstr **ppLVar7;
  ProfiledLabelInstr *pPVar8;
  LabelInstr **map;
  LabelInstr *instrLabel;
  Cloner *cloner;
  Func *func;
  BOOL fCreate_local;
  LabelInstr *this_local;
  
  this_00 = (this->super_Instr).m_func;
  pCVar4 = Func::GetCloner(this_00);
  map = (LabelInstr **)0x0;
  if (pCVar4 == (Cloner *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x214,"(cloner)","Use Func::BeginClone to initialize cloner");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (pCVar4->labelMap == (HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator> *)0x0) {
    if (fCreate == 0) {
      return (LabelInstr *)0x0;
    }
    pHVar6 = HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator>::New
                       (&pCVar4->alloc->super_ArenaAllocator,7);
    pCVar4->labelMap = pHVar6;
  }
  else {
    ppLVar7 = HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator>::Get(pCVar4->labelMap,this->m_id);
    if (ppLVar7 != (LabelInstr **)0x0) {
      map = (LabelInstr **)*ppLVar7;
    }
  }
  if (map == (LabelInstr **)0x0) {
    if (fCreate == 0) {
      return (LabelInstr *)0x0;
    }
    bVar3 = Instr::IsProfiledLabelInstr(&this->super_Instr);
    if (bVar3) {
      opcode = (this->super_Instr).m_opcode;
      pPVar8 = Instr::AsProfiledLabelInstr(&this->super_Instr);
      flags = pPVar8->loopImplicitCallFlags;
      pPVar8 = Instr::AsProfiledLabelInstr(&this->super_Instr);
      map = (LabelInstr **)ProfiledLabelInstr::New(opcode,this_00,flags,pPVar8->loopFlags);
      pPVar8 = Instr::AsProfiledLabelInstr(&this->super_Instr);
      uVar1 = pPVar8->loopNum;
      pPVar8 = Instr::AsProfiledLabelInstr((Instr *)map);
      pPVar8->loopNum = uVar1;
    }
    else {
      map = (LabelInstr **)
            New((this->super_Instr).m_opcode,this_00,((byte)this->field_0x78 >> 1 & 1) != 0);
    }
    *(byte *)(map + 0xf) = *(byte *)(map + 0xf) & 0xfe | this->field_0x78 & 1;
    HashTable<IR::LabelInstr_*,_Memory::ArenaAllocator>::FindOrInsert
              (pCVar4->labelMap,(LabelInstr *)map,this->m_id);
  }
  return (LabelInstr *)map;
}

Assistant:

LabelInstr *
LabelInstr::CloneLabel(BOOL fCreate)
{
    Func * func = this->m_func;
    Cloner * cloner = func->GetCloner();
    IR::LabelInstr * instrLabel = nullptr;

    AssertMsg(cloner, "Use Func::BeginClone to initialize cloner");

    if (cloner->labelMap == nullptr)
    {
        if (!fCreate)
        {
            return nullptr;
        }
        cloner->labelMap = HashTable<LabelInstr*>::New(cloner->alloc, 7);
    }
    else
    {
        IR::LabelInstr ** map = cloner->labelMap->Get(this->m_id);
        if (map)
        {
            instrLabel = *map;
        }
    }

    if (instrLabel == nullptr)
    {
        if (!fCreate)
        {
            return nullptr;
        }
        if (this->IsProfiledLabelInstr())
        {
            instrLabel = IR::ProfiledLabelInstr::New(this->m_opcode, func, this->AsProfiledLabelInstr()->loopImplicitCallFlags, this->AsProfiledLabelInstr()->loopFlags);
#if DBG
            instrLabel->AsProfiledLabelInstr()->loopNum = this->AsProfiledLabelInstr()->loopNum;
#endif
        }
        else
        {
            instrLabel = IR::LabelInstr::New(this->m_opcode, func, this->isOpHelper);
        }
        instrLabel->m_isLoopTop = this->m_isLoopTop;
        cloner->labelMap->FindOrInsert(instrLabel, this->m_id);
    }

    return instrLabel;
}